

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

void __thiscall
TIFFImageHandler::WriteXObjectCS(TIFFImageHandler *this,DictionaryContext *inContainerDictionary)

{
  float fVar1;
  float fVar2;
  DictionaryContext *this_00;
  DictionaryContext *labDictionary;
  float Z_W;
  float Y_W;
  float X_W;
  DictionaryContext *inContainerDictionary_local;
  TIFFImageHandler *this_local;
  
  if ((this->mT2p->pdf_colorspace & T2P_CS_ICCBASED) == 0) {
    if ((this->mT2p->pdf_colorspace & T2P_CS_PALETTE) == 0) {
      if (((this->mT2p->pdf_colorspace & T2P_CS_BILEVEL) != 0) &&
         (((this->mUserParameters).BWTreatment.AsImageMask & 1U) == 0)) {
        if (inContainerDictionary == (DictionaryContext *)0x0) {
          ObjectsContext::WriteName
                    (this->mObjectsContext,&scDeviceGray_abi_cxx11_,eTokenSeparatorSpace);
        }
        else {
          DictionaryContext::WriteNameValue(inContainerDictionary,&scDeviceGray_abi_cxx11_);
        }
      }
      if ((this->mT2p->pdf_colorspace & T2P_CS_GRAY) != 0) {
        if ((this->mT2p->pdf_colorspace & T2P_CS_CALGRAY) == 0) {
          if (((this->mUserParameters).GrayscaleTreatment.AsColorMap & 1U) == 0) {
            if (inContainerDictionary == (DictionaryContext *)0x0) {
              ObjectsContext::WriteName
                        (this->mObjectsContext,&scDeviceGray_abi_cxx11_,eTokenSeparatorSpace);
            }
            else {
              DictionaryContext::WriteNameValue(inContainerDictionary,&scDeviceGray_abi_cxx11_);
            }
          }
          else {
            WriteIndexedCSForBiLevelColorMap(this);
          }
        }
        else {
          WriteXObjectCALCS(this);
        }
      }
      if ((this->mT2p->pdf_colorspace & T2P_CS_RGB) != 0) {
        if ((this->mT2p->pdf_colorspace & T2P_CS_CALRGB) == 0) {
          if (inContainerDictionary == (DictionaryContext *)0x0) {
            ObjectsContext::WriteName
                      (this->mObjectsContext,&scDeviceRGB_abi_cxx11_,eTokenSeparatorSpace);
          }
          else {
            DictionaryContext::WriteNameValue(inContainerDictionary,&scDeviceRGB_abi_cxx11_);
          }
        }
        else {
          WriteXObjectCALCS(this);
        }
      }
      if ((this->mT2p->pdf_colorspace & T2P_CS_CMYK) != 0) {
        if (inContainerDictionary == (DictionaryContext *)0x0) {
          ObjectsContext::WriteName
                    (this->mObjectsContext,&scDeviceCMYK_abi_cxx11_,eTokenSeparatorSpace);
        }
        else {
          DictionaryContext::WriteNameValue(inContainerDictionary,&scDeviceCMYK_abi_cxx11_);
        }
      }
      if ((this->mT2p->pdf_colorspace & T2P_CS_LAB) != 0) {
        ObjectsContext::StartArray(this->mObjectsContext);
        ObjectsContext::WriteName(this->mObjectsContext,&scLab_abi_cxx11_,eTokenSeparatorSpace);
        this_00 = ObjectsContext::StartDictionary(this->mObjectsContext);
        DictionaryContext::WriteKey(this_00,&scWhitePoint_abi_cxx11_);
        fVar1 = this->mT2p->tiff_whitechromaticities[0];
        fVar2 = this->mT2p->tiff_whitechromaticities[1];
        ObjectsContext::StartArray(this->mObjectsContext);
        ObjectsContext::WriteDouble
                  (this->mObjectsContext,(double)(fVar1 / fVar2),eTokenSeparatorSpace);
        ObjectsContext::WriteDouble(this->mObjectsContext,1.0,eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  (this->mObjectsContext,(double)((1.0 - (fVar1 + fVar2)) / fVar2),
                   eTokenSeparatorSpace);
        ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorNone);
        ObjectsContext::StartArray(this->mObjectsContext);
        ObjectsContext::WriteDouble(this->mObjectsContext,0.9642956256866455,eTokenSeparatorSpace);
        ObjectsContext::WriteDouble(this->mObjectsContext,1.0,eTokenSeparatorSpace);
        ObjectsContext::WriteDouble(this->mObjectsContext,0.8251045346260071,eTokenSeparatorSpace);
        ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
        DictionaryContext::WriteKey(this_00,&scRange_abi_cxx11_);
        ObjectsContext::StartArray(this->mObjectsContext);
        ObjectsContext::WriteInteger
                  (this->mObjectsContext,(long)this->mT2p->pdf_labrange[0],eTokenSeparatorSpace);
        ObjectsContext::WriteInteger
                  (this->mObjectsContext,(long)this->mT2p->pdf_labrange[1],eTokenSeparatorSpace);
        ObjectsContext::WriteInteger
                  (this->mObjectsContext,(long)this->mT2p->pdf_labrange[2],eTokenSeparatorSpace);
        ObjectsContext::WriteInteger
                  (this->mObjectsContext,(long)this->mT2p->pdf_labrange[3],eTokenSeparatorSpace);
        ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
        ObjectsContext::EndDictionary(this->mObjectsContext,this_00);
        ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
      }
    }
    else {
      ObjectsContext::StartArray(this->mObjectsContext);
      ObjectsContext::WriteName(this->mObjectsContext,&scIndexed_abi_cxx11_,eTokenSeparatorSpace);
      this->mT2p->pdf_colorspace = this->mT2p->pdf_colorspace ^ T2P_CS_PALETTE;
      WriteXObjectCS(this,(DictionaryContext *)0x0);
      this->mT2p->pdf_colorspace = this->mT2p->pdf_colorspace | T2P_CS_PALETTE;
      ObjectsContext::WriteInteger
                (this->mObjectsContext,
                 (long)((1 << ((byte)this->mT2p->tiff_bitspersample & 0x1f)) + -1),
                 eTokenSeparatorSpace);
      ObjectsContext::WriteNewIndirectObjectReference
                (this->mObjectsContext,this->mT2p->pdf_palettecs,eTokenSeparatorSpace);
      ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
    }
  }
  else {
    ObjectsContext::StartArray(this->mObjectsContext);
    ObjectsContext::WriteName(this->mObjectsContext,&scICCBased_abi_cxx11_,eTokenSeparatorSpace);
    ObjectsContext::WriteNewIndirectObjectReference
              (this->mObjectsContext,this->mT2p->pdf_icccs,eTokenSeparatorSpace);
    ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  }
  return;
}

Assistant:

void TIFFImageHandler::WriteXObjectCS(DictionaryContext* inContainerDictionary)
{
	float X_W=1.0;
	float Y_W=1.0;
	float Z_W=1.0;
	
	if( (mT2p->pdf_colorspace & T2P_CS_ICCBASED) != 0)
	{
		mObjectsContext->StartArray();
		mObjectsContext->WriteName(scICCBased);
		mObjectsContext->WriteNewIndirectObjectReference(mT2p->pdf_icccs);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
		return;
	}

	if( (mT2p->pdf_colorspace & T2P_CS_PALETTE) != 0)
	{
		mObjectsContext->StartArray();
		mObjectsContext->WriteName(scIndexed);
		mT2p->pdf_colorspace = (t2p_cs_t)(mT2p->pdf_colorspace ^ T2P_CS_PALETTE);
		WriteXObjectCS(NULL);
		mT2p->pdf_colorspace = (t2p_cs_t)(mT2p->pdf_colorspace | T2P_CS_PALETTE);
		mObjectsContext->WriteInteger((0x0001 << mT2p->tiff_bitspersample)-1);
		mObjectsContext->WriteNewIndirectObjectReference(mT2p->pdf_palettecs);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
		return;
	}

	if((mT2p->pdf_colorspace & T2P_CS_BILEVEL) && !mUserParameters.BWTreatment.AsImageMask)
	{
		if(inContainerDictionary)
			inContainerDictionary->WriteNameValue(scDeviceGray);
		else
			mObjectsContext->WriteName(scDeviceGray);
	}
		
	if(mT2p->pdf_colorspace & T2P_CS_GRAY)
	{
		if(mT2p->pdf_colorspace & T2P_CS_CALGRAY)
		{
			WriteXObjectCALCS();
		} 
		else 
		{
			if(mUserParameters.GrayscaleTreatment.AsColorMap)
			{
				WriteIndexedCSForBiLevelColorMap();
			}
			else
			{
				if(inContainerDictionary)
					inContainerDictionary->WriteNameValue(scDeviceGray);
				else
					mObjectsContext->WriteName(scDeviceGray);
			}
		}
	}

	if(mT2p->pdf_colorspace & T2P_CS_RGB)
	{
		if(mT2p->pdf_colorspace & T2P_CS_CALRGB)
		{
			WriteXObjectCALCS();
		} 
		else 
		{
			if(inContainerDictionary)
				inContainerDictionary->WriteNameValue(scDeviceRGB);
			else
				mObjectsContext->WriteName(scDeviceRGB);
		}
	}

	if(mT2p->pdf_colorspace & T2P_CS_CMYK)
	{
		if(inContainerDictionary)
			inContainerDictionary->WriteNameValue(scDeviceCMYK);
		else
			mObjectsContext->WriteName(scDeviceCMYK);
	}

	if(mT2p->pdf_colorspace & T2P_CS_LAB)
	{
		mObjectsContext->StartArray();
		mObjectsContext->WriteName(scLab);

		DictionaryContext* labDictionary = mObjectsContext->StartDictionary();
		labDictionary->WriteKey(scWhitePoint);
		X_W = mT2p->tiff_whitechromaticities[0];
		Y_W = mT2p->tiff_whitechromaticities[1];
		Z_W = 1.0F - (X_W + Y_W);
		X_W /= Y_W;
		Z_W /= Y_W;
		Y_W = 1.0F;
		mObjectsContext->StartArray();
		mObjectsContext->WriteDouble(X_W);
		mObjectsContext->WriteDouble(Y_W);
		mObjectsContext->WriteDouble(Z_W);
		mObjectsContext->EndArray();
		
		X_W = 0.3457F; /* 0.3127F; */ /* D50, commented D65 */
		Y_W = 0.3585F; /* 0.3290F; */
		Z_W = 1.0F - (X_W + Y_W);
		X_W /= Y_W;
		Z_W /= Y_W;
		Y_W = 1.0F;
		mObjectsContext->StartArray();
		mObjectsContext->WriteDouble(X_W);
		mObjectsContext->WriteDouble(Y_W);
		mObjectsContext->WriteDouble(Z_W);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);

		labDictionary->WriteKey(scRange);
		mObjectsContext->StartArray();
		mObjectsContext->WriteInteger(mT2p->pdf_labrange[0]);
		mObjectsContext->WriteInteger(mT2p->pdf_labrange[1]);
		mObjectsContext->WriteInteger(mT2p->pdf_labrange[2]);
		mObjectsContext->WriteInteger(mT2p->pdf_labrange[3]);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
		
		mObjectsContext->EndDictionary(labDictionary);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
			
	}
}